

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_pushstring(lua_State *L,char *str)

{
  uint32_t uVar1;
  ulong uVar2;
  size_t lenx;
  GCstr *pGVar3;
  TValue *pTVar4;
  
  if (str == (char *)0x0) {
    pTVar4 = L->top;
    uVar1 = 0xffffffff;
  }
  else {
    uVar2 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar2 + 0x54) <= *(uint *)(uVar2 + 0x50)) {
      lj_gc_step(L);
    }
    lenx = strlen(str);
    pGVar3 = lj_str_new(L,str,lenx);
    pTVar4 = L->top;
    (pTVar4->u32).lo = (uint32_t)pGVar3;
    uVar1 = 0xfffffffb;
  }
  (pTVar4->field_2).it = uVar1;
  pTVar4 = L->top;
  L->top = pTVar4 + 1;
  if (pTVar4 + 1 < (TValue *)(ulong)(L->maxstack).ptr32) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

LUA_API void lua_pushstring(lua_State *L, const char *str)
{
  if (str == NULL) {
    setnilV(L->top);
  } else {
    GCstr *s;
    lj_gc_check(L);
    s = lj_str_newz(L, str);
    setstrV(L, L->top, s);
  }
  incr_top(L);
}